

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O2

void glmc_euler_xzy_quat(float *angles,float *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = sinf(*angles * 0.5);
  fVar2 = cosf(*angles * 0.5);
  fVar3 = sinf(angles[1] * 0.5);
  fVar4 = cosf(angles[1] * 0.5);
  fVar5 = sinf(angles[2] * 0.5);
  fVar6 = cosf(angles[2] * 0.5);
  *dest = fVar3 * -fVar2 * fVar5 + fVar1 * fVar6 * fVar4;
  dest[1] = fVar3 * fVar6 * fVar2 + -(fVar1 * fVar5) * fVar4;
  dest[2] = fVar4 * fVar5 * fVar2 + fVar1 * fVar6 * fVar3;
  dest[3] = fVar4 * fVar6 * fVar2 + fVar1 * fVar5 * fVar3;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_xzy_quat(vec3 angles, versor dest) {
  glm_euler_xzy_quat(angles, dest);
}